

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_cost_model_impl.h
# Opt level: O3

double __thiscall
cost_model::UnitCostModelJSON<label::JSONLabel>::ren
          (UnitCostModelJSON<label::JSONLabel> *this,int label_id_1,int label_id_2)

{
  pointer pJVar1;
  int iVar2;
  double dVar3;
  
  pJVar1 = (this->ld_->id_to_label_dictionary_).
           super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pJVar1[label_id_1].type_ == pJVar1[label_id_2].type_) {
    iVar2 = std::__cxx11::string::compare((string *)(pJVar1 + label_id_1));
    dVar3 = 0.0;
    if (iVar2 != 0) {
      dVar3 = 1.0;
    }
    return dVar3;
  }
  return INFINITY;
}

Assistant:

double UnitCostModelJSON<Label>::ren(const int label_id_1,
    const int label_id_2) const {
  if (ld_.get(label_id_1).get_type() != ld_.get(label_id_2).get_type())
    return std::numeric_limits<double>::infinity();

  if (ld_.get(label_id_1).get_label().compare(ld_.get(label_id_2).get_label()) 
      == 0)
    return 0.0;
  else
    return 1.0;
}